

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O0

int file_is_obu(ObuDecInputContext *obu_ctx)

{
  AvxInputContext *input_ctx;
  int iVar1;
  int iVar2;
  void *pvVar3;
  long *in_RDI;
  int status;
  size_t payload_bytes;
  size_t bytes_read;
  uint64_t unit_size;
  size_t annexb_header_length;
  size_t length_of_unit_size;
  ObuHeader obu_header;
  size_t payload_length;
  int is_annexb;
  uint8_t detect_buf [34];
  AvxInputContext *avx_ctx;
  undefined1 buffered;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  uint64_t *in_stack_ffffffffffffff60;
  long lVar5;
  size_t *in_stack_ffffffffffffff68;
  AvxInputContext *input_ctx_00;
  uint8_t *value_buffer;
  AvxInputContext *input_ctx_01;
  size_t *payload_length_00;
  size_t *in_stack_ffffffffffffff88;
  char cVar6;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff9c;
  size_t in_stack_ffffffffffffffa0;
  AvxInputContext *input_ctx_02;
  undefined1 local_48 [8];
  ObuHeader *in_stack_ffffffffffffffc0;
  int local_4;
  
  if ((in_RDI == (long *)0x0) || (*in_RDI == 0)) {
    return 0;
  }
  input_ctx = (AvxInputContext *)*in_RDI;
  memset(local_48,0,0x22);
  iVar2 = (int)in_RDI[4];
  input_ctx_02 = (AvxInputContext *)0x0;
  memset(&stack0xffffffffffffff88,0,0x20);
  payload_length_00 = (size_t *)0x0;
  input_ctx_01 = (AvxInputContext *)0x0;
  value_buffer = (uint8_t *)0x0;
  if (iVar2 != 0) {
    iVar1 = obudec_read_leb128((AvxInputContext *)0x0,(uint8_t *)0x0,in_stack_ffffffffffffff68,
                               in_stack_ffffffffffffff60,
                               SUB41((uint)in_stack_ffffffffffffff5c >> 0x18,0));
    if (iVar1 != 0) {
      fprintf(_stderr,"obudec: Failure reading temporal unit header\n");
      rewind_detect(input_ctx);
      return 0;
    }
    iVar1 = obudec_read_leb128(input_ctx_01,value_buffer,in_stack_ffffffffffffff68,
                               in_stack_ffffffffffffff60,
                               SUB41((uint)in_stack_ffffffffffffff5c >> 0x18,0));
    if (iVar1 != 0) {
      fprintf(_stderr,"obudec: Failure reading frame unit header\n");
      rewind_detect(input_ctx);
      return 0;
    }
    input_ctx_01 = (AvxInputContext *)((long)payload_length_00 + (long)input_ctx_01);
  }
  input_ctx_00 = (AvxInputContext *)0x0;
  buffered = (undefined1)((ulong)&stack0xffffffffffffff88 >> 0x38);
  uVar4 = 1;
  iVar1 = obudec_read_obu_header_and_size
                    (input_ctx_02,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88,payload_length_00,in_stack_ffffffffffffffc0,
                     SUB81((ulong)input_ctx_01 >> 0x38,0));
  if (iVar1 == 0) {
    if (iVar2 != 0) {
      input_ctx_00 = (AvxInputContext *)
                     ((input_ctx_00->detect).buf + (long)(&input_ctx_01->detect + -1) + 8);
    }
    cVar6 = (char)in_stack_ffffffffffffff90;
    if ((cVar6 == '\x02') || (cVar6 == '\x01')) {
      if (in_stack_ffffffffffffff94 == 0) {
        if (iVar2 == 0) {
          fprintf(_stderr,"obudec: OBU size fields required, cannot decode input.\n");
          rewind_detect(input_ctx);
          return 0;
        }
      }
      else if ((cVar6 == '\x02') && (input_ctx_02 != (AvxInputContext *)0x0)) {
        fprintf(_stderr,"obudec: Invalid OBU_TEMPORAL_DELIMITER payload length (non-zero).");
        rewind_detect(input_ctx);
        return 0;
      }
      pvVar3 = malloc(0x7d000);
      in_RDI[1] = (long)pvVar3;
      if (in_RDI[1] == 0) {
        fprintf(_stderr,"Out of memory.\n");
        rewind_detect(input_ctx);
        local_4 = 0;
      }
      else {
        in_RDI[2] = 0x7d000;
        memcpy((void *)in_RDI[1],local_48,(size_t)input_ctx_00);
        in_RDI[3] = (long)input_ctx_00;
        if (input_ctx_02 != (AvxInputContext *)0x0) {
          if ((AvxInputContext *)(in_RDI[2] - (long)input_ctx_00) < input_ctx_02) {
            fprintf(_stderr,"obudec: First OBU\'s payload is too large\n");
            rewind_detect(input_ctx);
            obudec_free((ObuDecInputContext *)0x11f0f1);
            return 0;
          }
          lVar5 = 0;
          iVar2 = obudec_read_obu_payload
                            (input_ctx_00,0,
                             (uint8_t *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                             (size_t *)CONCAT44(in_stack_ffffffffffffff54,uVar4),(_Bool)buffered);
          if (iVar2 < 0) {
            rewind_detect(input_ctx);
            obudec_free((ObuDecInputContext *)0x11f15a);
            return 0;
          }
          in_RDI[3] = lVar5 + in_RDI[3];
        }
        local_4 = 1;
      }
    }
    else {
      rewind_detect(input_ctx);
      local_4 = 0;
    }
  }
  else {
    fprintf(_stderr,"obudec: Failure reading first OBU.\n");
    rewind_detect(input_ctx);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int file_is_obu(struct ObuDecInputContext *obu_ctx) {
  if (!obu_ctx || !obu_ctx->avx_ctx) return 0;

  struct AvxInputContext *avx_ctx = obu_ctx->avx_ctx;
  uint8_t detect_buf[OBU_DETECTION_SIZE] = { 0 };
  const int is_annexb = obu_ctx->is_annexb;
  size_t payload_length = 0;
  ObuHeader obu_header;
  memset(&obu_header, 0, sizeof(obu_header));
  size_t length_of_unit_size = 0;
  size_t annexb_header_length = 0;
  uint64_t unit_size = 0;

  if (is_annexb) {
    // read the size of first temporal unit
    if (obudec_read_leb128(avx_ctx, &detect_buf[0], &length_of_unit_size,
                           &unit_size, /*buffered=*/true) != 0) {
      fprintf(stderr, "obudec: Failure reading temporal unit header\n");
      rewind_detect(avx_ctx);
      return 0;
    }

    // read the size of first frame unit
    if (obudec_read_leb128(avx_ctx, &detect_buf[length_of_unit_size],
                           &annexb_header_length, &unit_size,
                           /*buffered=*/true) != 0) {
      fprintf(stderr, "obudec: Failure reading frame unit header\n");
      rewind_detect(avx_ctx);
      return 0;
    }
    annexb_header_length += length_of_unit_size;
  }

  size_t bytes_read = 0;
  if (obudec_read_obu_header_and_size(
          avx_ctx, OBU_DETECTION_SIZE - annexb_header_length, is_annexb,
          &detect_buf[annexb_header_length], &bytes_read, &payload_length,
          &obu_header, /*buffered=*/true) != 0) {
    fprintf(stderr, "obudec: Failure reading first OBU.\n");
    rewind_detect(avx_ctx);
    return 0;
  }

  if (is_annexb) {
    bytes_read += annexb_header_length;
  }

  if (obu_header.type != OBU_TEMPORAL_DELIMITER &&
      obu_header.type != OBU_SEQUENCE_HEADER) {
    rewind_detect(avx_ctx);
    return 0;
  }

  if (obu_header.has_size_field) {
    if (obu_header.type == OBU_TEMPORAL_DELIMITER && payload_length != 0) {
      fprintf(
          stderr,
          "obudec: Invalid OBU_TEMPORAL_DELIMITER payload length (non-zero).");
      rewind_detect(avx_ctx);
      return 0;
    }
  } else if (!is_annexb) {
    fprintf(stderr, "obudec: OBU size fields required, cannot decode input.\n");
    rewind_detect(avx_ctx);
    return 0;
  }

  // Appears that input is valid Section 5 AV1 stream.
  obu_ctx->buffer = (uint8_t *)malloc(OBU_BUFFER_SIZE);
  if (!obu_ctx->buffer) {
    fprintf(stderr, "Out of memory.\n");
    rewind_detect(avx_ctx);
    return 0;
  }
  obu_ctx->buffer_capacity = OBU_BUFFER_SIZE;

  memcpy(obu_ctx->buffer, &detect_buf[0], bytes_read);
  obu_ctx->bytes_buffered = bytes_read;
  // If the first OBU is a SEQUENCE_HEADER, then it will have a payload.
  // We need to read this in so that our buffer only contains complete OBUs.
  if (payload_length > 0) {
    if (payload_length > (obu_ctx->buffer_capacity - bytes_read)) {
      fprintf(stderr, "obudec: First OBU's payload is too large\n");
      rewind_detect(avx_ctx);
      obudec_free(obu_ctx);
      return 0;
    }

    size_t payload_bytes = 0;
    const int status = obudec_read_obu_payload(
        avx_ctx, payload_length, &obu_ctx->buffer[bytes_read], &payload_bytes,
        /*buffered=*/false);
    if (status < 0) {
      rewind_detect(avx_ctx);
      obudec_free(obu_ctx);
      return 0;
    }
    obu_ctx->bytes_buffered += payload_bytes;
  }
  return 1;
}